

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O1

ktx_error_code_e ktxHashList_Sort(ktxHashList *pHead)

{
  long lVar1;
  int iVar2;
  UT_hash_handle *pUVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  UT_hash_handle *pUVar8;
  UT_hash_handle *pUVar9;
  UT_hash_handle *pUVar10;
  UT_hash_handle *pUVar11;
  UT_hash_handle *pUVar12;
  bool bVar13;
  uint local_50;
  
  if (pHead == (ktxHashList *)0x0) {
    return KTX_INVALID_VALUE;
  }
  if (*pHead == (ktxHashList)0x0) {
    return KTX_SUCCESS;
  }
  iVar5 = 1;
  pUVar10 = &(*pHead)->hh;
LAB_001eb8c6:
  if (pUVar10 != (UT_hash_handle *)0x0) {
    pUVar12 = (UT_hash_handle *)0x0;
    pUVar8 = (UT_hash_handle *)0x0;
    local_50 = 0;
LAB_001eb8f6:
    pUVar11 = pUVar10;
    iVar7 = 0;
    if (iVar5 != 0) {
      iVar6 = 1;
      do {
        if (pUVar11->next == (void *)0x0) {
          pUVar11 = (UT_hash_handle *)0x0;
        }
        else {
          pUVar11 = (UT_hash_handle *)((long)pUVar11->next + (((*pHead)->hh).tbl)->hho);
        }
        if (pUVar11 == (UT_hash_handle *)0x0) {
          pUVar11 = (UT_hash_handle *)0x0;
          iVar7 = iVar6;
          break;
        }
        bVar13 = iVar6 != iVar5;
        iVar6 = iVar6 + 1;
        iVar7 = iVar5;
      } while (bVar13);
    }
    local_50 = local_50 + 1;
    iVar6 = iVar5;
    do {
      pUVar3 = pUVar11;
      if (iVar7 == 0) {
        if (pUVar3 == (UT_hash_handle *)0x0 || iVar6 == 0) goto LAB_001eba60;
        if (pUVar3->next == (void *)0x0) {
          pUVar11 = (UT_hash_handle *)0x0;
        }
        else {
          pUVar11 = (UT_hash_handle *)((long)pUVar3->next + (((*pHead)->hh).tbl)->hho);
        }
        iVar6 = iVar6 + -1;
        iVar7 = 0;
      }
      else {
        pUVar11 = pUVar3;
        if (pUVar3 == (UT_hash_handle *)0x0 || iVar6 == 0) {
          if (pUVar10->next == (void *)0x0) {
            pUVar9 = (UT_hash_handle *)0x0;
          }
          else {
            pUVar9 = (UT_hash_handle *)((long)pUVar10->next + (((*pHead)->hh).tbl)->hho);
          }
          iVar7 = iVar7 + -1;
          pUVar3 = pUVar10;
          pUVar10 = pUVar9;
        }
        else {
          lVar1 = (((*pHead)->hh).tbl)->hho;
          iVar2 = strcmp(*(char **)((long)pUVar10 + (8 - lVar1)),
                         *(char **)((long)pUVar3 + (8 - lVar1)));
          if (iVar2 < 1) {
            pUVar9 = (UT_hash_handle *)(lVar1 + (long)pUVar10->next);
            if (pUVar10->next == (void *)0x0) {
              pUVar9 = (UT_hash_handle *)0x0;
            }
            iVar7 = iVar7 + -1;
            pUVar3 = pUVar10;
            pUVar10 = pUVar9;
          }
          else {
            pUVar11 = (UT_hash_handle *)(lVar1 + (long)pUVar3->next);
            if (pUVar3->next == (void *)0x0) {
              pUVar11 = (UT_hash_handle *)0x0;
            }
            iVar6 = iVar6 + -1;
          }
        }
      }
      pUVar9 = pUVar3;
      if (pUVar12 != (UT_hash_handle *)0x0) {
        if (pUVar3 == (UT_hash_handle *)0x0) {
          pvVar4 = (void *)0x0;
        }
        else {
          pvVar4 = (void *)((long)pUVar3 - (((*pHead)->hh).tbl)->hho);
        }
        pUVar12->next = pvVar4;
        pUVar9 = pUVar8;
      }
      if (pUVar12 == (UT_hash_handle *)0x0) {
        pvVar4 = (void *)0x0;
      }
      else {
        pvVar4 = (void *)((long)pUVar12 - (((*pHead)->hh).tbl)->hho);
      }
      pUVar3->prev = pvVar4;
      pUVar8 = pUVar9;
      pUVar12 = pUVar3;
    } while( true );
  }
  bVar13 = true;
  pUVar8 = (UT_hash_handle *)0x0;
  pUVar12 = (UT_hash_handle *)0x0;
  goto LAB_001eba7b;
LAB_001eba60:
  pUVar10 = pUVar3;
  if (pUVar3 == (UT_hash_handle *)0x0) goto code_r0x001eba70;
  goto LAB_001eb8f6;
code_r0x001eba70:
  bVar13 = local_50 < 2;
LAB_001eba7b:
  pUVar12->next = (void *)0x0;
  if (bVar13) {
    (((*pHead)->hh).tbl)->tail = pUVar12;
    *pHead = (ktxHashList)((long)pUVar8 - (((*pHead)->hh).tbl)->hho);
  }
  iVar5 = iVar5 * 2;
  pUVar10 = pUVar8;
  if (bVar13) {
    return KTX_SUCCESS;
  }
  goto LAB_001eb8c6;
}

Assistant:

KTX_error_code
ktxHashList_Sort(ktxHashList* pHead)
{
    if (pHead) {
        //ktxKVListEntry* kv = (ktxKVListEntry*)pHead;

        HASH_SORT(*pHead, sort_by_key_codepoint);
        return KTX_SUCCESS;
    } else {
        return KTX_INVALID_VALUE;
    }
}